

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qwizard.cpp
# Opt level: O2

bool __thiscall QWizardPrivate::buttonLayoutContains(QWizardPrivate *this,WizardButton which)

{
  bool bVar1;
  long in_FS_OFFSET;
  WizardButton local_c;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  bVar1 = true;
  local_c = which;
  if (this->buttonsHaveCustomLayout == true) {
    bVar1 = QListSpecialMethodsBase<QWizard::WizardButton>::contains<QWizard::WizardButton>
                      ((QListSpecialMethodsBase<QWizard::WizardButton> *)&this->buttonsCustomLayout,
                       &local_c);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return bVar1;
  }
  __stack_chk_fail();
}

Assistant:

bool QWizardPrivate::buttonLayoutContains(QWizard::WizardButton which)
{
    return !buttonsHaveCustomLayout || buttonsCustomLayout.contains(which);
}